

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ym2610::write_data_hi(ym2610 *this,uint8_t data)

{
  uint32_t uVar1;
  ymfm_interface *pyVar2;
  size_t in_RCX;
  uint8_t data_local;
  ym2610 *this_local;
  
  uVar1 = bitfield((uint)this->m_address,8,1);
  if (uVar1 != 0) {
    if (this->m_address < 0x130) {
      adpcm_a_engine::write(&this->m_adpcm_a,this->m_address & 0x3f,(void *)(ulong)data,in_RCX);
    }
    else {
      fm_engine_base<ymfm::opn_registers_base<true>_>::write
                ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,
                 (uint)this->m_address,(void *)(ulong)data,in_RCX);
    }
    pyVar2 = fm_engine_base<ymfm::opn_registers_base<true>_>::intf
                       ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
    uVar1 = fm_engine_base<ymfm::opn_registers_base<true>_>::clock_prescale
                      ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
    (*(code *)pyVar2->m_engine[3]._vptr_ymfm_engine_callbacks)(pyVar2,uVar1 << 5);
  }
  return;
}

Assistant:

void ym2610::write_data_hi(uint8_t data)
{
	// ignore if paired with upper address
	if (!bitfield(m_address, 8))
		return;

	if (m_address < 0x130)
	{
		// 100-12F: write to ADPCM-A
		m_adpcm_a.write(m_address & 0x3f, data);
	}
	else
	{
		// 130-1FF: write to FM
		m_fm.write(m_address, data);
	}

	// mark busy for a bit
	m_fm.intf().ymfm_set_busy_end(32 * m_fm.clock_prescale());
}